

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O1

BOOL MiscPutenv(char *string,BOOL deleteIfEmpty)

{
  bool bVar1;
  int iVar2;
  CPalThread *pThread;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  char **ppcVar6;
  int iVar7;
  size_t szSize;
  long lVar8;
  char *__s;
  long lVar9;
  BOOL BVar10;
  char *local_38;
  
  pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  if (pThread == (CPalThread *)0x0) {
    pThread = CreateCurrentThreadData();
  }
  pcVar3 = strchr(string,0x3d);
  if (pcVar3 != (char *)0x0 && pcVar3 != string) {
    if ((deleteIfEmpty == 0) || (pcVar3[1] != '\0')) {
      local_38 = CorUnix::InternalStrdup(string);
      if (local_38 != (char *)0x0) {
        CorUnix::InternalEnterCriticalSection(pThread,&gcsEnvironment);
        ppcVar6 = palEnvironment;
        __s = *palEnvironment;
        if (__s == (char *)0x0) {
          iVar7 = 0;
          lVar9 = 0;
          BVar10 = 0;
        }
        else {
          sVar4 = (size_t)((int)pcVar3 - (int)string);
          lVar9 = 0;
          iVar7 = 0;
          do {
            pcVar3 = strchr(__s,0x3d);
            if (pcVar3 == (char *)0x0) {
              sVar5 = strlen(__s);
              pcVar3 = __s + sVar5;
            }
            if (((long)pcVar3 - (long)__s == sVar4) &&
               (iVar2 = memcmp(string,__s,sVar4), iVar2 == 0)) {
              ppcVar6[lVar9] = local_38;
              BVar10 = 1;
              local_38 = (char *)0x0;
              goto LAB_00313888;
            }
            iVar7 = iVar7 + 1;
            lVar9 = (long)iVar7;
            __s = ppcVar6[lVar9];
          } while (__s != (char *)0x0);
          BVar10 = 0;
        }
LAB_00313888:
        bVar1 = true;
        if (palEnvironment[lVar9] == (char *)0x0) {
          szSize = (long)(iVar7 + 2) << 3;
          if (MiscPutenv::sAllocatedEnviron == '\x01') {
            ppcVar6 = (char **)CorUnix::InternalRealloc(palEnvironment,szSize);
            if (ppcVar6 == (char **)0x0) goto LAB_0031372d;
          }
          else {
            ppcVar6 = (char **)CorUnix::InternalMalloc(szSize);
            if (ppcVar6 == (char **)0x0) goto LAB_0031372d;
            pcVar3 = *palEnvironment;
            if (pcVar3 != (char *)0x0) {
              iVar2 = 1;
              lVar8 = 0;
              do {
                ppcVar6[lVar8] = pcVar3;
                lVar8 = (long)iVar2;
                pcVar3 = palEnvironment[lVar8];
                iVar2 = iVar2 + 1;
              } while (pcVar3 != (char *)0x0);
            }
            MiscPutenv::sAllocatedEnviron = '\x01';
          }
          palEnvironment = ppcVar6;
          _environ = ppcVar6;
          ppcVar6[lVar9] = local_38;
          palEnvironment[iVar7 + 1] = (char *)0x0;
          BVar10 = 1;
          local_38 = (char *)0x0;
        }
        goto LAB_0031372d;
      }
    }
    else {
      sVar4 = strlen(string);
      local_38 = (char *)CorUnix::InternalMalloc((long)(int)sVar4);
      if (local_38 != (char *)0x0) {
        sVar4 = (long)((sVar4 << 0x20) + -0x100000000) >> 0x20;
        memcpy(local_38,string,sVar4);
        local_38[sVar4] = '\0';
        MiscUnsetenv(local_38);
        BVar10 = 1;
        bVar1 = false;
        goto LAB_0031372d;
      }
    }
  }
  local_38 = (char *)0x0;
  bVar1 = false;
  BVar10 = 0;
LAB_0031372d:
  if (bVar1) {
    CorUnix::InternalLeaveCriticalSection(pThread,&gcsEnvironment);
  }
  if (local_38 != (char *)0x0) {
    CorUnix::InternalFree(local_38);
  }
  return BVar10;
}

Assistant:

BOOL MiscPutenv(const char *string, BOOL deleteIfEmpty)
{
    const char *equals, *existingEquals;
    char *copy = NULL;
    int length;
    int i, j;
    bool fOwningCS = false;
    BOOL result = FALSE;
    CPalThread * pthrCurrent = InternalGetCurrentThread();

    equals = strchr(string, '=');
    if (equals == string || equals == NULL)
    {
        // "=foo" and "foo" have no meaning
        goto done;
    }
    if (equals[1] == '\0' && deleteIfEmpty)
    {
        // "foo=" removes foo from the environment in _putenv() on Windows.
        // The same string can result from a call to SetEnvironmentVariable()
        // with the empty string as the value, but in that case we want to
        // set the variable's value to "". deleteIfEmpty will be FALSE in
        // that case.
        length = strlen(string);
        copy = (char *) InternalMalloc(length);
        if (copy == NULL)
        {
            goto done;
        }
        memcpy(copy, string, length - 1);
        copy[length - 1] = '\0';    // Change '=' to '\0'
        MiscUnsetenv(copy);
        result = TRUE;
    }
    else
    {
        // See if we are replacing an item or adding one.

        // Make our copy up front, since we'll use it either way.
        copy = InternalStrdup(string);
        if (copy == NULL)
        {
            goto done;
        }

        length = equals - string;

        InternalEnterCriticalSection(pthrCurrent, &gcsEnvironment);
        fOwningCS = true;

        for(i = 0; palEnvironment[i] != NULL; i++)
        {
            existingEquals = strchr(palEnvironment[i], '=');
            if (existingEquals == NULL)
            {
                // The PAL screens out malformed strings, but
                // environ comes from the system, so it might
                // have strings without '='. We treat the entire
                // string as a name in that case.
                existingEquals = palEnvironment[i] + strlen(palEnvironment[i]);
            }
            if (existingEquals - palEnvironment[i] == length)
            {
                if (memcmp(string, palEnvironment[i], length) == 0)
                {
                    // Replace this one. Don't free the original,
                    // though, because there may be outstanding
                    // references to it that were acquired via
                    // getenv. This is an unavoidable memory leak.
                    palEnvironment[i] = copy;

                    // Set 'copy' to NULL so it won't be freed
                    copy = NULL;

                    result = TRUE;
                    break;
                }
            }
        }
        if (palEnvironment[i] == NULL)
        {
            static BOOL sAllocatedEnviron = FALSE;
            // Add a new environment variable.
            // We'd like to realloc palEnvironment, but we can't do that the
            // first time through.
            char **newEnviron = NULL;

            if (sAllocatedEnviron) {
                if (NULL == (newEnviron =
                        (char **)InternalRealloc(palEnvironment, (i + 2) * sizeof(char *))))
                {
                    goto done;
                }
            }
            else
            {
                // Allocate palEnvironment ourselves so we can realloc it later.
                newEnviron = (char **)InternalMalloc((i + 2) * sizeof(char *));
                if (newEnviron == NULL)
                {
                    goto done;
                }
                for(j = 0; palEnvironment[j] != NULL; j++)
                {
                    newEnviron[j] = palEnvironment[j];
                }
                sAllocatedEnviron = TRUE;
            }
            palEnvironment = newEnviron;
            MiscSetEnvArray();
            palEnvironment[i] = copy;
            palEnvironment[i + 1] = NULL;

            // Set 'copy' to NULL so it won't be freed
            copy = NULL;

            result = TRUE;
        }
    }
done:

    if (fOwningCS)
    {
        InternalLeaveCriticalSection(pthrCurrent, &gcsEnvironment);
    }
    if (NULL != copy)
    {
        InternalFree(copy);
    }
    return result;
}